

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.hxx
# Opt level: O0

void __thiscall
args::Subparser::Subparser(Subparser *this,Command *command_,HelpParams *helpParams_)

{
  function<bool_(const_args::Group_&)> local_60;
  string local_40;
  HelpParams *local_20;
  HelpParams *helpParams__local;
  Command *command__local;
  Subparser *this_local;
  
  local_20 = helpParams_;
  helpParams__local = (HelpParams *)command_;
  command__local = (Command *)this;
  std::__cxx11::string::string((string *)&local_40);
  std::function<bool(args::Group_const&)>::function<bool(&)(args::Group_const&),void>
            ((function<bool(args::Group_const&)> *)&local_60,Group::Validators::AllChildGroups);
  Group::Group(&this->super_Group,&local_40,&local_60,None);
  std::function<bool_(const_args::Group_&)>::~function(&local_60);
  std::__cxx11::string::~string((string *)&local_40);
  (this->super_Group).super_Base._vptr_Base = (_func_int **)&PTR__Subparser_00366350;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->args);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->kicked);
  this->parser = (ArgumentParser *)0x0;
  this->helpParams = local_20;
  this->command = (Command *)helpParams__local;
  this->isParsed = false;
  return;
}

Assistant:

Subparser(const Command &command_, const HelpParams &helpParams_) : Group({}, Validators::AllChildGroups), helpParams(helpParams_), command(command_)
            {
            }